

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

bool __thiscall
ON_SubDComponentFilter::AcceptComponent
          (ON_SubDComponentFilter *this,ON_COMPONENT_INDEX component_index,ON_Geometry *geometry)

{
  uint uVar1;
  bool bVar2;
  Type TVar3;
  uint uVar4;
  ON_SubDComponentPtr local_38;
  ON_SubDComponentPtr cptr;
  ON_SubDComponentRef *cref;
  ON_Geometry *geometry_local;
  ON_SubDComponentFilter *this_local;
  uint uStack_10;
  ON_COMPONENT_INDEX component_index_local;
  
  unique0x100000fe = component_index;
  bVar2 = ON_COMPONENT_INDEX::IsSubDComponentIndex((ON_COMPONENT_INDEX *)((long)&this_local + 4));
  if (bVar2) {
    cptr.m_ptr = (ON__UINT_PTR)ON_SubDComponentRef::Cast(&geometry->super_ON_Object);
    if ((ON_SubDComponentRef *)cptr.m_ptr == (ON_SubDComponentRef *)0x0) {
      component_index_local.m_type._3_1_ = invalid_type >> 0x18;
    }
    else {
      local_38 = ON_SubDComponentRef::ComponentPtr((ON_SubDComponentRef *)cptr.m_ptr);
      uVar1 = uStack_10;
      uVar4 = ON_SubDComponentPtr::ComponentId(&local_38);
      if (uVar1 == uVar4) {
        if (this_local._4_4_ == subd_vertex) {
          TVar3 = ON_SubDComponentPtr::ComponentType(&local_38);
          if (TVar3 != Vertex) {
            return false;
          }
        }
        else if (this_local._4_4_ == subd_edge) {
          TVar3 = ON_SubDComponentPtr::ComponentType(&local_38);
          if (TVar3 != Edge) {
            return false;
          }
        }
        else if ((this_local._4_4_ == subd_face) &&
                (TVar3 = ON_SubDComponentPtr::ComponentType(&local_38), TVar3 != Face)) {
          return false;
        }
        component_index_local.m_type._3_1_ = AcceptComponent(this,local_38);
      }
      else {
        component_index_local.m_type._3_1_ = invalid_type >> 0x18;
      }
    }
  }
  else {
    component_index_local.m_type._3_1_ = invalid_type >> 0x18;
  }
  return (bool)component_index_local.m_type._3_1_;
}

Assistant:

bool ON_SubDComponentFilter::AcceptComponent(ON_COMPONENT_INDEX component_index, const class ON_Geometry* geometry) const
{
  if (false == component_index.IsSubDComponentIndex())
    return false;
  const ON_SubDComponentRef* cref = ON_SubDComponentRef::Cast(geometry);
  if (nullptr == cref)
    return false;
  const ON_SubDComponentPtr cptr = cref->ComponentPtr();
  if (component_index.m_index != (int)cptr.ComponentId())
    return false;
  switch (component_index.m_type)
  {
  case ON_COMPONENT_INDEX::TYPE::subd_vertex:
    if (ON_SubDComponentPtr::Type::Vertex != cptr.ComponentType())
      return false;
    break;
  case ON_COMPONENT_INDEX::TYPE::subd_edge:
    if (ON_SubDComponentPtr::Type::Edge != cptr.ComponentType())
      return false;
    break;
  case ON_COMPONENT_INDEX::TYPE::subd_face:
    if (ON_SubDComponentPtr::Type::Face != cptr.ComponentType())
      return false;
    break;
  default: // 30 unhandled enum values
    break;
  }
  return AcceptComponent(cptr);
}